

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbabilityEval.cpp
# Opt level: O3

int32_t ProbMap::checkFd(string *ele,char base,string2int32 *fd_map)

{
  int32_t iVar1;
  size_t sVar2;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (ele,base);
  sVar2 = robin_hood::detail::
          Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
          ::findIdx<std::__cxx11::string>
                    ((Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                      *)fd_map,ele);
  if (fd_map->mKeyVals + sVar2 == (Node *)fd_map->mInfo) {
    iVar1 = 0;
  }
  else {
    iVar1 = fd_map->mKeyVals[sVar2].mData.second;
  }
  return iVar1;
}

Assistant:

int32_t ProbMap::checkFd(string ele, char base, const string2int32 &fd_map) {
    ele += base;
    auto res = fd_map.find(ele);
    if (res == fd_map.end()) {
        return 0;
    } else {
        return res->second;
    }
}